

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-kv-cache.cpp
# Opt level: O3

bool __thiscall
llama_kv_cache_unified::state_read_data
          (llama_kv_cache_unified *this,llama_io_read_i *io,uint32_t cell_count)

{
  ggml_tensor *pgVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  int iVar4;
  ulong uVar5;
  uint il;
  char *pcVar6;
  ulong uVar7;
  ggml_type gVar8;
  ulong uVar9;
  long lVar10;
  ggml_type gVar11;
  long lVar12;
  int32_t k_type_i_ref;
  uint32_t n_layer;
  uint64_t k_size_row_ref;
  uint32_t v_trans;
  uint32_t n_embd_v_gqa_ref;
  ggml_type local_74;
  uint32_t local_70;
  uint local_6c;
  ggml_type local_68;
  undefined4 uStack_64;
  uint local_5c;
  ulong local_58;
  ggml_type local_50;
  ggml_type local_4c;
  ulong local_48;
  llama_kv_cache_unified *local_40;
  long local_38;
  
  (*io->_vptr_llama_io_read_i[3])(io,&local_5c,4);
  (*io->_vptr_llama_io_read_i[3])(io,&local_6c,4);
  uVar9 = (ulong)local_6c;
  if (local_6c == this->hparams->n_layer) {
    if (cell_count <= this->size) {
      if (1 < local_5c) {
        llama_log_internal(GGML_LOG_LEVEL_ERROR,"%s: incompatible V transposition\n",
                           "state_read_data");
        return false;
      }
      if (local_6c != 0) {
        local_58 = (ulong)cell_count;
        uVar9 = 0;
        local_70 = cell_count;
        do {
          uVar2 = llama_hparams::n_embd_k_gqa(this->hparams,(uint32_t)uVar9);
          uVar3 = llama_hparams::n_embd_k_s(this->hparams);
          (*io->_vptr_llama_io_read_i[3])(io,&local_74,4);
          gVar8 = (this->k_l).super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar9]->type;
          if (gVar8 != local_74) {
            pcVar6 = "%s: mismatched key type (%d != %d, layer %d)\n";
            goto LAB_001b297e;
          }
          (*io->_vptr_llama_io_read_i[3])(io,&local_68,8);
          uVar5 = ggml_row_size((this->k_l).
                                super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>.
                                _M_impl.super__Vector_impl_data._M_start[uVar9]->type,uVar3 + uVar2)
          ;
          uVar7 = CONCAT44(uStack_64,local_68);
          if (uVar5 != uVar7) {
            pcVar6 = "%s: mismatched key row size (%zu != %zu, layer %d)\n";
            goto LAB_001b29a2;
          }
          if (cell_count != 0) {
            pgVar1 = (this->k_l).super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar9];
            lVar12 = uVar5 * local_58;
            iVar4 = (*io->_vptr_llama_io_read_i[2])(io,lVar12);
            cell_count = local_70;
            ggml_backend_tensor_set(pgVar1,iVar4,this->head * uVar5,lVar12);
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 < local_6c);
        if (local_5c == 0) {
          if (local_6c != 0) {
            uVar9 = 0;
            do {
              uVar2 = llama_hparams::n_embd_v_gqa(this->hparams,(uint32_t)uVar9);
              uVar3 = llama_hparams::n_embd_v_s(this->hparams);
              (*io->_vptr_llama_io_read_i[3])(io,&local_74,4);
              gVar8 = (this->v_l).super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar9]->type;
              if (gVar8 != local_74) {
                pcVar6 = "%s: mismatched value type (%d != %d, layer %d)\n";
LAB_001b297e:
                uVar9 = uVar9 & 0xffffffff;
                goto LAB_001b298f;
              }
              (*io->_vptr_llama_io_read_i[3])(io,&local_68,8);
              uVar5 = ggml_row_size((this->v_l).
                                    super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start[uVar9]->type,
                                    uVar3 + uVar2);
              uVar7 = CONCAT44(uStack_64,local_68);
              if (uVar5 != uVar7) {
                pcVar6 = "%s: mismatched value row size (%zu != %zu, layer %d)\n";
LAB_001b29a2:
                uVar9 = uVar9 & 0xffffffff;
                goto LAB_001b29b6;
              }
              if (cell_count != 0) {
                pgVar1 = (this->v_l).
                         super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar9];
                lVar12 = uVar5 * local_58;
                iVar4 = (*io->_vptr_llama_io_read_i[2])(io,lVar12);
                cell_count = local_70;
                ggml_backend_tensor_set(pgVar1,iVar4,this->head * uVar5,lVar12);
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 < local_6c);
          }
        }
        else if (local_6c != 0) {
          il = 0;
          local_40 = this;
          do {
            uVar2 = llama_hparams::n_embd_v_gqa(this->hparams,il);
            uVar3 = llama_hparams::n_embd_v_s(this->hparams);
            (*io->_vptr_llama_io_read_i[3])(io,&local_68,4);
            uVar9 = (ulong)il;
            gVar8 = (this->v_l).super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar9]->type;
            if (gVar8 != local_68) {
              pcVar6 = "%s: mismatched value type (%d != %d, layer %d)\n";
              local_74 = local_68;
              goto LAB_001b298f;
            }
            (*io->_vptr_llama_io_read_i[3])(io,&local_74,4);
            uVar5 = ggml_type_size((this->v_l).
                                   super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start[uVar9]->type);
            uVar7 = (ulong)local_74;
            if (uVar5 != uVar7) {
              pcVar6 = "%s: mismatched value element size (%zu != %zu, layer %d)\n";
LAB_001b29b6:
              llama_log_internal(GGML_LOG_LEVEL_ERROR,pcVar6,"state_read_data",uVar5,uVar7,uVar9);
              return false;
            }
            gVar8 = uVar3 + uVar2;
            local_48 = uVar5;
            (*io->_vptr_llama_io_read_i[3])(io,&local_4c,4);
            if (gVar8 != local_4c) {
              pcVar6 = "%s: mismatched GQA embedding size (%u != %u, layer %d)\n";
              local_74 = local_4c;
LAB_001b298f:
              llama_log_internal(GGML_LOG_LEVEL_ERROR,pcVar6,"state_read_data",(ulong)gVar8,
                                 (ulong)local_74,uVar9);
              return false;
            }
            if ((cell_count != 0) && (cell_count = local_70, gVar8 != GGML_TYPE_F32)) {
              local_38 = local_48 * local_58;
              gVar11 = GGML_TYPE_F32;
              local_50 = gVar8;
              do {
                lVar12 = local_38;
                lVar10 = (this->size * gVar11 + this->head) * local_48;
                pgVar1 = (this->v_l).
                         super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar9];
                iVar4 = (*io->_vptr_llama_io_read_i[2])(io,local_38);
                this = local_40;
                gVar8 = local_50;
                ggml_backend_tensor_set(pgVar1,iVar4,lVar10,lVar12);
                gVar11 = gVar11 + GGML_TYPE_F16;
                cell_count = local_70;
              } while (gVar8 != gVar11);
            }
            il = il + 1;
          } while (il < local_6c);
        }
      }
      return true;
    }
    pcVar6 = "%s: not enough cells in kv cache to restore state (%u > %u)\n";
    uVar9 = (ulong)cell_count;
  }
  else {
    pcVar6 = "%s: mismatched layer count (%u instead of %u)\n";
  }
  llama_log_internal(GGML_LOG_LEVEL_ERROR,pcVar6,"state_read_data",uVar9);
  return false;
}

Assistant:

bool llama_kv_cache_unified::state_read_data(llama_io_read_i & io, uint32_t cell_count) {
    uint32_t v_trans;
    uint32_t n_layer;
    io.read_to(&v_trans, sizeof(v_trans));
    io.read_to(&n_layer, sizeof(n_layer));

    if (n_layer != hparams.n_layer) {
        LLAMA_LOG_ERROR("%s: mismatched layer count (%u instead of %u)\n", __func__, n_layer, hparams.n_layer);
        return false;
    }
    if (cell_count > size) {
        LLAMA_LOG_ERROR("%s: not enough cells in kv cache to restore state (%u > %u)\n", __func__, cell_count, size);
        return false;
    }
    if (v_trans != (bool) v_trans) {
        LLAMA_LOG_ERROR("%s: incompatible V transposition\n", __func__);
        return false;
    }

    // For each layer, read the keys for each cell, one row is one cell, read as one contiguous block
    for (uint32_t il = 0; il < n_layer; ++il) {
        const uint32_t n_embd_k_gqa = hparams.n_embd_k_gqa(il) + hparams.n_embd_k_s();

        // Read type of key
        int32_t k_type_i_ref;
        io.read_to(&k_type_i_ref, sizeof(k_type_i_ref));
        const int32_t k_type_i = (int32_t) k_l[il]->type;
        if (k_type_i != k_type_i_ref) {
            LLAMA_LOG_ERROR("%s: mismatched key type (%d != %d, layer %d)\n", __func__, k_type_i, k_type_i_ref, il);
            return false;
        }

        // Read row size of key
        uint64_t k_size_row_ref;
        io.read_to(&k_size_row_ref, sizeof(k_size_row_ref));
        const size_t k_size_row = ggml_row_size(k_l[il]->type, n_embd_k_gqa);
        if (k_size_row != k_size_row_ref) {
            LLAMA_LOG_ERROR("%s: mismatched key row size (%zu != %zu, layer %d)\n", __func__, k_size_row, (size_t) k_size_row_ref, il);
            return false;
        }

        if (cell_count) {
            // Read and set the keys for the whole cell range
            ggml_backend_tensor_set(k_l[il], io.read(cell_count * k_size_row), head * k_size_row, cell_count * k_size_row);
        }
    }

    if (!v_trans) {
        for (uint32_t il = 0; il < n_layer; ++il) {
            const uint32_t n_embd_v_gqa = hparams.n_embd_v_gqa(il) + hparams.n_embd_v_s();

            // Read type of value
            int32_t v_type_i_ref;
            io.read_to(&v_type_i_ref, sizeof(v_type_i_ref));
            const int32_t v_type_i = (int32_t)v_l[il]->type;
            if (v_type_i != v_type_i_ref) {
                LLAMA_LOG_ERROR("%s: mismatched value type (%d != %d, layer %d)\n", __func__, v_type_i, v_type_i_ref, il);
                return false;
            }

            // Read row size of value
            uint64_t v_size_row_ref;
            io.read_to(&v_size_row_ref, sizeof(v_size_row_ref));
            const size_t v_size_row = ggml_row_size(v_l[il]->type, n_embd_v_gqa);
            if (v_size_row != v_size_row_ref) {
                LLAMA_LOG_ERROR("%s: mismatched value row size (%zu != %zu, layer %d)\n", __func__, v_size_row, (size_t) v_size_row_ref, il);
                return false;
            }

            if (cell_count) {
                // Read and set the values for the whole cell range
                ggml_backend_tensor_set(v_l[il], io.read(cell_count * v_size_row), head * v_size_row, cell_count * v_size_row);
            }
        }
    } else {
        // For each layer, read the values for each cell (transposed)
        for (uint32_t il = 0; il < n_layer; ++il) {
            const uint32_t n_embd_v_gqa = hparams.n_embd_v_gqa(il) + hparams.n_embd_v_s();

            // Read type of value
            int32_t v_type_i_ref;
            io.read_to(&v_type_i_ref, sizeof(v_type_i_ref));
            const int32_t v_type_i = (int32_t)v_l[il]->type;
            if (v_type_i != v_type_i_ref) {
                LLAMA_LOG_ERROR("%s: mismatched value type (%d != %d, layer %d)\n", __func__, v_type_i, v_type_i_ref, il);
                return false;
            }

            // Read element size of value
            uint32_t v_size_el_ref;
            io.read_to(&v_size_el_ref, sizeof(v_size_el_ref));
            const size_t v_size_el = ggml_type_size(v_l[il]->type);
            if (v_size_el != v_size_el_ref) {
                LLAMA_LOG_ERROR("%s: mismatched value element size (%zu != %zu, layer %d)\n", __func__, v_size_el, (size_t) v_size_el_ref, il);
                return false;
            }

            // Read GQA embedding size
            uint32_t n_embd_v_gqa_ref;
            io.read_to(&n_embd_v_gqa_ref, sizeof(n_embd_v_gqa_ref));
            if (n_embd_v_gqa != n_embd_v_gqa_ref) {
                LLAMA_LOG_ERROR("%s: mismatched GQA embedding size (%u != %u, layer %d)\n", __func__, n_embd_v_gqa, n_embd_v_gqa_ref, il);
                return false;
            }

            if (cell_count) {
                // For each row in the transposed matrix, read the values for the whole cell range
                for (uint32_t j = 0; j < n_embd_v_gqa; ++j) {
                    const size_t dst_offset = (head + j * size) * v_size_el;
                    ggml_backend_tensor_set(v_l[il], io.read(cell_count * v_size_el), dst_offset, cell_count * v_size_el);
                }
            }
        }
    }

    return true;
}